

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemsemaphore_systemv.cpp
# Opt level: O3

key_t __thiscall
QSystemSemaphoreSystemV::handle
          (QSystemSemaphoreSystemV *this,QSystemSemaphorePrivate *self,AccessMode mode)

{
  QArrayData *data;
  QChar *data_00;
  qsizetype qVar1;
  QArrayData *data_01;
  char16_t *pcVar2;
  bool bVar3;
  int iVar4;
  key_t __key;
  int *piVar5;
  char *pcVar6;
  long in_FS_OFFSET;
  QLatin1StringView function;
  QAnyStringView a;
  QAnyStringView a_00;
  QAnyStringView a_01;
  QString local_60;
  QString local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = this->unix_key;
  if (iVar4 != -1) goto LAB_0049b198;
  data = &((self->nativeKey).key.d.d)->super_QArrayData;
  data_00 = (QChar *)(self->nativeKey).key.d.ptr;
  qVar1 = (self->nativeKey).key.d.size;
  if (data != (QArrayData *)0x0) {
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QString::toLocal8Bit_helper((QByteArray *)&local_48,data_00,qVar1);
  data_01 = &((this->nativeKeyFile).d.d)->super_QArrayData;
  pcVar2 = (char16_t *)(this->nativeKeyFile).d.ptr;
  (this->nativeKeyFile).d.d = (Data *)local_48.d.d;
  (this->nativeKeyFile).d.ptr = (char *)local_48.d.ptr;
  qVar1 = (this->nativeKeyFile).d.size;
  (this->nativeKeyFile).d.size = local_48.d.size;
  local_48.d.d = (Data *)data_01;
  local_48.d.ptr = pcVar2;
  local_48.d.size = qVar1;
  if (data_01 != (QArrayData *)0x0) {
    LOCK();
    (data_01->ref_)._q_value.super___atomic_base<int>._M_i =
         (data_01->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((data_01->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(data_01,1,0x10);
    }
  }
  if (data != (QArrayData *)0x0) {
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(data,2,0x10);
    }
  }
  if ((this->nativeKeyFile).d.size == 0) {
    QCoreApplication::translate(&local_60,"QSystemSemaphore","%1: key is empty",(char *)0x0,-1);
    a.m_size = 0x4000000000000019;
    a.field_0.m_data_utf8 = "QSystemSemaphore::handle:";
    QString::arg_impl(&local_48,&local_60,a,0,(QChar)0x20);
LAB_0049b0a4:
    self->error = KeyError;
    QString::operator=(&self->errorString,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    pcVar6 = (this->nativeKeyFile).d.ptr;
    if (pcVar6 == (char *)0x0) {
      pcVar6 = &QByteArray::_empty;
    }
    do {
      iVar4 = open64(pcVar6,0x800c2,0x1a0);
      if (iVar4 != -1) {
        if (-1 < iVar4) {
          close(iVar4);
          bVar3 = true;
          goto LAB_0049afaa;
        }
        piVar5 = __errno_location();
        iVar4 = *piVar5;
        break;
      }
      piVar5 = __errno_location();
      iVar4 = *piVar5;
    } while (iVar4 == 4);
    if (iVar4 != 0x11) {
      QCoreApplication::translate
                (&local_60,"QSystemSemaphore","%1: unable to make key",(char *)0x0,-1);
      a_00.m_size = 0x4000000000000019;
      a_00.field_0.m_data_utf8 = "QSystemSemaphore::handle:";
      QString::arg_impl(&local_48,&local_60,a_00,0,(QChar)0x20);
      goto LAB_0049b0a4;
    }
    bVar3 = false;
LAB_0049afaa:
    this->createdFile = bVar3;
    pcVar6 = (this->nativeKeyFile).d.ptr;
    if (pcVar6 == (char *)0x0) {
      pcVar6 = &QByteArray::_empty;
    }
    __key = ftok(pcVar6,(uint)(self->nativeKey).typeAndFlags.type);
    this->unix_key = __key;
    if (__key == -1) {
      QCoreApplication::translate(&local_60,"QSystemSemaphore","%1: ftok failed",(char *)0x0,-1);
      a_01.m_size = 0x4000000000000019;
      a_01.field_0.m_data_utf8 = "QSystemSemaphore::handle:";
      QString::arg_impl(&local_48,&local_60,a_01,0,(QChar)0x20);
      goto LAB_0049b0a4;
    }
    iVar4 = semget(__key,1,0x780);
    this->semaphore = iVar4;
    if (iVar4 != -1) {
      this->createdFile = true;
      this->createdSemaphore = true;
LAB_0049aff9:
      if (mode == Create) {
        this->createdFile = true;
        this->createdSemaphore = true;
LAB_0049b143:
        if ((-1 < (long)self->initialValue) &&
           (iVar4 = semctl(iVar4,0,0x10,(long)self->initialValue | 0xaaaaaaaa00000000), iVar4 == -1)
           ) goto LAB_0049b174;
      }
      else if ((this->createdSemaphore & 1U) != 0) goto LAB_0049b143;
      iVar4 = this->unix_key;
      goto LAB_0049b198;
    }
    piVar5 = __errno_location();
    if (*piVar5 == 0x11) {
      iVar4 = semget(this->unix_key,1,0x380);
      this->semaphore = iVar4;
      if (iVar4 != -1) goto LAB_0049aff9;
    }
LAB_0049b174:
    function.m_data = "QSystemSemaphore::handle";
    function.m_size = 0x18;
    QSystemSemaphorePrivate::setUnixErrorString(self,function);
    cleanHandle(this,self);
  }
  iVar4 = -1;
LAB_0049b198:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

key_t QSystemSemaphoreSystemV::handle(QSystemSemaphorePrivate *self, QSystemSemaphore::AccessMode mode)
{
    if (unix_key != -1)
        return unix_key;  // we already have a semaphore

#if defined(Q_OS_DARWIN)
    if (qt_apple_isSandboxed()) {
        // attempting to use System V semaphores will get us a SIGSYS
        self->setError(QSystemSemaphore::PermissionDenied,
                       QSystemSemaphore::tr("%1: System V semaphores are not available for "
                                            "sandboxed applications. Please build Qt with "
                                            "-feature-ipc_posix")
                       .arg("QSystemSemaphore::handle:"_L1));
        return -1;
    }
#endif

    nativeKeyFile = QFile::encodeName(self->nativeKey.nativeKey());
    if (nativeKeyFile.isEmpty()) {
        self->setError(QSystemSemaphore::KeyError,
                       QSystemSemaphore::tr("%1: key is empty")
                       .arg("QSystemSemaphore::handle:"_L1));
        return -1;
    }

    // ftok requires that an actual file exists somewhere
    int built = QtIpcCommon::createUnixKeyFile(nativeKeyFile);
    if (-1 == built) {
        self->setError(QSystemSemaphore::KeyError,
                       QSystemSemaphore::tr("%1: unable to make key")
                       .arg("QSystemSemaphore::handle:"_L1));

        return -1;
    }
    createdFile = (1 == built);

    // Get the unix key for the created file
    unix_key = ftok(nativeKeyFile, int(self->nativeKey.type()));
    if (-1 == unix_key) {
        self->setError(QSystemSemaphore::KeyError,
                       QSystemSemaphore::tr("%1: ftok failed")
                       .arg("QSystemSemaphore::handle:"_L1));
        return -1;
    }

    // Get semaphore
    semaphore = semget(unix_key, 1, 0600 | IPC_CREAT | IPC_EXCL);
    if (-1 == semaphore) {
        if (errno == EEXIST)
            semaphore = semget(unix_key, 1, 0600 | IPC_CREAT);
        if (-1 == semaphore) {
            self->setUnixErrorString("QSystemSemaphore::handle"_L1);
            cleanHandle(self);
            return -1;
        }
    } else {
        createdSemaphore = true;
        // Force cleanup of file, it is possible that it can be left over from a crash
        createdFile = true;
    }

    if (mode == QSystemSemaphore::Create) {
        createdSemaphore = true;
        createdFile = true;
    }

    // Created semaphore so initialize its value.
    if (createdSemaphore && self->initialValue >= 0) {
        qt_semun init_op;
        init_op.val = self->initialValue;
        if (-1 == semctl(semaphore, 0, SETVAL, init_op)) {
            self->setUnixErrorString("QSystemSemaphore::handle"_L1);
            cleanHandle(self);
            return -1;
        }
    }

    return unix_key;
}